

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Nonnull<char_*> __thiscall absl::lts_20250127::Cord::InlineRep::set_data(InlineRep *this,size_t n)

{
  char *pcVar1;
  size_t n_local;
  InlineRep *this_local;
  
  if (n < 0x10) {
    ResetToEmpty(this);
    set_inline_size(this,n);
    pcVar1 = cord_internal::InlineData::as_chars(&this->data_);
    return pcVar1;
  }
  __assert_fail("n <= kMaxInline",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0xb1,"absl::Nonnull<char *> absl::Cord::InlineRep::set_data(size_t)");
}

Assistant:

inline absl::Nonnull<char*> Cord::InlineRep::set_data(size_t n) {
  assert(n <= kMaxInline);
  ResetToEmpty();
  set_inline_size(n);
  return data_.as_chars();
}